

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_string.cc
# Opt level: O2

string * Rtrim(string *s)

{
  pointer local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_28 = (s->_M_dataplus)._M_p;
  local_20.current._M_current =
       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(local_28 + s->_M_string_length);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_18,&local_20,
             (unary_negate<std::pointer_to_unary_function<int,_int>_>)&local_28);
  std::__cxx11::string::erase(s,local_18._M_current,(s->_M_dataplus)._M_p + s->_M_string_length);
  return s;
}

Assistant:

std::string &Rtrim(std::string &s) {
    s.erase(std::find_if(s.rbegin(), s.rend(),
            std::not1(std::ptr_fun<int, int>(std::isspace))).base(), s.end());
    return s;
}